

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_posix.hpp
# Opt level: O0

void __thiscall
chaiscript::detail::Loadable_Module::DLSym<std::shared_ptr<chaiscript::Module>_(*)()>::DLSym
          (DLSym<std::shared_ptr<chaiscript::Module>_(*)()> *this,DLModule *t_mod,string *t_symbol)

{
  void *pvVar1;
  char *pcVar2;
  _func_shared_ptr<chaiscript::Module> *p_Var3;
  load_module_error *this_00;
  allocator<char> local_41;
  string local_40;
  string *local_20;
  string *t_symbol_local;
  DLModule *t_mod_local;
  DLSym<std::shared_ptr<chaiscript::Module>_(*)()> *this_local;
  
  pvVar1 = t_mod->m_data;
  local_20 = t_symbol;
  t_symbol_local = (string *)t_mod;
  t_mod_local = (DLModule *)this;
  pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (t_symbol);
  p_Var3 = (_func_shared_ptr<chaiscript::Module> *)dlsym(pvVar1,pcVar2);
  this->m_symbol = p_Var3;
  if (this->m_symbol == (_func_shared_ptr<chaiscript::Module> *)0x0) {
    this_00 = (load_module_error *)__cxa_allocate_exception(0x10);
    pcVar2 = (char *)dlerror();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,pcVar2,&local_41);
    chaiscript::exception::load_module_error::load_module_error(this_00,&local_40);
    __cxa_throw(this_00,&chaiscript::exception::load_module_error::typeinfo,
                chaiscript::exception::load_module_error::~load_module_error);
  }
  return;
}

Assistant:

DLSym(DLModule &t_mod, const std::string &t_symbol)
          : m_symbol(reinterpret_cast<T>(dlsym(t_mod.m_data, t_symbol.c_str()))) {
        if (!m_symbol) {
          throw chaiscript::exception::load_module_error(dlerror());
        }
      }